

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_FonRangeSize(Cba_Ntk_t *p,int f)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  char *__nptr;
  int iVar5;
  
  if (f < 0) {
    __nptr = Abc_NamStr(p->pDesign->pFuns,~f);
    iVar5 = atoi(__nptr);
    return iVar5;
  }
  if (f != 0) {
    iVar5 = 0;
    if (0 < (p->vFonRange).nSize) {
      uVar3 = Vec_IntGetEntry(&p->vFonRange,f);
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      iVar5 = 0;
      if (1 < uVar3) {
        pVVar1 = p->pDesign->vHash->vObjs;
        uVar3 = uVar3 * 2 & 0xfffffffc;
        if (pVVar1->nSize <= (int)uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar2 = pVVar1->pArray;
        iVar5 = piVar2[uVar3] - piVar2[(ulong)uVar3 + 1];
      }
    }
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    return iVar4 + 1;
  }
  __assert_fail("Cba_FonIsReal(f)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x180,"int Cba_FonRange(Cba_Ntk_t *, int)");
}

Assistant:

static inline int            Cba_FonRangeSize( Cba_Ntk_t * p, int f )        { return Cba_FonIsConst(f) ? Cba_FonConstRangeSize(p, f):Cba_NtkRangeSize(p, Cba_FonRange(p, f)); }